

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder.c
# Opt level: O1

lzma_ret lzma_lz_encoder_init
                   (lzma_next_coder *next,lzma_allocator *allocator,lzma_filter_info *filters,
                   _func_lzma_ret_lzma_lz_encoder_ptr_lzma_allocator_ptr_void_ptr_lzma_lz_options_ptr
                   *lz_init)

{
  lzma_mf *mf;
  uint uVar1;
  _Bool _Var2;
  lzma_ret lVar3;
  lzma_lz_encoder *plVar4;
  void *pvVar5;
  _func_lzma_ret_void_ptr_lzma_mf_ptr_uint8_t_ptr_size_t_ptr_size_t *p_Var6;
  size_t size;
  lzma_lz_options_conflict lz_options;
  lzma_lz_options_conflict lStack_68;
  
  plVar4 = (lzma_lz_encoder *)next->coder;
  if (plVar4 == (lzma_lz_encoder *)0x0) {
    plVar4 = (lzma_lz_encoder *)lzma_alloc(0xe0,allocator);
    if (plVar4 != (lzma_lz_encoder *)0x0) {
      next->coder = plVar4;
      next->code = lz_encode;
      next->end = lz_encoder_end;
      next->update = lz_encoder_update;
      plVar4[1].coder = (void *)0x0;
      *(undefined4 *)&plVar4[1].code = 0;
      *(undefined8 *)((long)&plVar4[4].code + 4) = 0;
      plVar4->coder = (void *)0x0;
      plVar4->code = (_func_lzma_ret_void_ptr_lzma_mf_ptr_uint8_t_ptr_size_t_ptr_size_t *)0x0;
      plVar4->end = (_func_void_void_ptr_lzma_allocator_ptr *)0x0;
      plVar4[3].coder = (void *)0x0;
      plVar4[3].code = (_func_lzma_ret_void_ptr_lzma_mf_ptr_uint8_t_ptr_size_t_ptr_size_t *)0x0;
      plVar4[4].options_update = (_func_lzma_ret_void_ptr_lzma_filter_ptr *)0x0;
      plVar4[5].coder = (void *)0xffffffffffffffff;
      plVar4[5].code = (_func_lzma_ret_void_ptr_lzma_mf_ptr_uint8_t_ptr_size_t_ptr_size_t *)0x0;
      plVar4[5].end = (_func_void_void_ptr_lzma_allocator_ptr *)0x0;
      plVar4[5].options_update = (_func_lzma_ret_void_ptr_lzma_filter_ptr *)0x0;
      plVar4[6].coder = (void *)0x0;
      plVar4[6].code = (_func_lzma_ret_void_ptr_lzma_mf_ptr_uint8_t_ptr_size_t_ptr_size_t *)0x0;
      plVar4[6].end = (_func_void_void_ptr_lzma_allocator_ptr *)0x0;
      plVar4[6].options_update = (_func_lzma_ret_void_ptr_lzma_filter_ptr *)0x0;
      goto LAB_001b12db;
    }
LAB_001b143e:
    lVar3 = LZMA_MEM_ERROR;
  }
  else {
LAB_001b12db:
    lVar3 = (*lz_init)(plVar4,allocator,filters->options,&lStack_68);
    if (lVar3 != LZMA_OK) {
      return lVar3;
    }
    mf = (lzma_mf *)(plVar4 + 1);
    _Var2 = lz_encoder_prepare(mf,allocator,&lStack_68);
    if (_Var2) {
      return LZMA_OPTIONS_ERROR;
    }
    if (mf->buffer == (uint8_t *)0x0) {
      pvVar5 = lzma_alloc((ulong)(*(int *)&plVar4[1].code + 8),allocator);
      plVar4[1].coder = pvVar5;
      if (pvVar5 == (void *)0x0) goto LAB_001b143e;
      *(undefined8 *)((long)pvVar5 + (ulong)*(uint *)&plVar4[1].code) = 0;
    }
    *(undefined4 *)((long)&plVar4[1].end + 4) = *(undefined4 *)((long)&plVar4[3].end + 4);
    plVar4[1].options_update = (_func_lzma_ret_void_ptr_lzma_filter_ptr *)0x0;
    plVar4[2].coder = (void *)0x0;
    *(undefined4 *)&plVar4[2].code = 0;
    size = (ulong)*(uint *)((long)&plVar4[4].code + 4) << 2;
    if (plVar4[3].coder == (void *)0x0) {
      pvVar5 = lzma_alloc_zero(size,allocator);
      plVar4[3].coder = pvVar5;
      p_Var6 = (_func_lzma_ret_void_ptr_lzma_mf_ptr_uint8_t_ptr_size_t_ptr_size_t *)
               lzma_alloc((ulong)*(uint *)&plVar4[4].end << 2,allocator);
      plVar4[3].code = p_Var6;
      if ((plVar4[3].coder == (void *)0x0) ||
         (p_Var6 == (_func_lzma_ret_void_ptr_lzma_mf_ptr_uint8_t_ptr_size_t_ptr_size_t *)0x0)) {
        lzma_free(plVar4[3].coder,allocator);
        plVar4[3].coder = (void *)0x0;
        lzma_free(plVar4[3].code,allocator);
        plVar4[3].code = (_func_lzma_ret_void_ptr_lzma_mf_ptr_uint8_t_ptr_size_t_ptr_size_t *)0x0;
        goto LAB_001b143e;
      }
    }
    else {
      memset(plVar4[3].coder,0,size);
    }
    *(undefined4 *)&plVar4[3].end = 0;
    if ((lStack_68.preset_dict != (uint8_t *)0x0) && ((ulong)lStack_68.preset_dict_size != 0)) {
      uVar1 = *(uint *)&plVar4[1].code;
      if (lStack_68.preset_dict_size < *(uint *)&plVar4[1].code) {
        uVar1 = lStack_68.preset_dict_size;
      }
      *(uint *)((long)&plVar4[2].coder + 4) = uVar1;
      memcpy(plVar4[1].coder,
             lStack_68.preset_dict + ((ulong)lStack_68.preset_dict_size - (ulong)uVar1),(ulong)uVar1
            );
      *(undefined4 *)&plVar4[4].code = 1;
      (*plVar4[2].options_update)(mf,(lzma_filter *)*(undefined4 *)((long)&plVar4[2].coder + 4));
    }
    *(undefined4 *)&plVar4[4].code = 0;
    lVar3 = lzma_next_filter_init
                      ((lzma_next_coder *)&plVar4[4].options_update,allocator,filters + 1);
  }
  return lVar3;
}

Assistant:

static bool
lz_encoder_init(lzma_mf *mf, const lzma_allocator *allocator,
		const lzma_lz_options *lz_options)
{
	// Allocate the history buffer.
	if (mf->buffer == NULL) {
		// lzma_memcmplen() is used for the dictionary buffer
		// so we need to allocate a few extra bytes to prevent
		// it from reading past the end of the buffer.
		mf->buffer = lzma_alloc(mf->size + LZMA_MEMCMPLEN_EXTRA,
				allocator);
		if (mf->buffer == NULL)
			return true;

		// Keep Valgrind happy with lzma_memcmplen() and initialize
		// the extra bytes whose value may get read but which will
		// effectively get ignored.
		memzero(mf->buffer + mf->size, LZMA_MEMCMPLEN_EXTRA);
	}

	// Use cyclic_size as initial mf->offset. This allows
	// avoiding a few branches in the match finders. The downside is
	// that match finder needs to be normalized more often, which may
	// hurt performance with huge dictionaries.
	mf->offset = mf->cyclic_size;
	mf->read_pos = 0;
	mf->read_ahead = 0;
	mf->read_limit = 0;
	mf->write_pos = 0;
	mf->pending = 0;

#if UINT32_MAX >= SIZE_MAX / 4
	// Check for integer overflow. (Huge dictionaries are not
	// possible on 32-bit CPU.)
	if (mf->hash_count > SIZE_MAX / sizeof(uint32_t)
			|| mf->sons_count > SIZE_MAX / sizeof(uint32_t))
		return true;
#endif

	// Allocate and initialize the hash table. Since EMPTY_HASH_VALUE
	// is zero, we can use lzma_alloc_zero() or memzero() for mf->hash.
	//
	// We don't need to initialize mf->son, but not doing that may
	// make Valgrind complain in normalization (see normalize() in
	// lz_encoder_mf.c). Skipping the initialization is *very* good
	// when big dictionary is used but only small amount of data gets
	// actually compressed: most of the mf->son won't get actually
	// allocated by the kernel, so we avoid wasting RAM and improve
	// initialization speed a lot.
	if (mf->hash == NULL) {
		mf->hash = lzma_alloc_zero(mf->hash_count * sizeof(uint32_t),
				allocator);
		mf->son = lzma_alloc(mf->sons_count * sizeof(uint32_t),
				allocator);

		if (mf->hash == NULL || mf->son == NULL) {
			lzma_free(mf->hash, allocator);
			mf->hash = NULL;

			lzma_free(mf->son, allocator);
			mf->son = NULL;

			return true;
		}
	} else {
/*
		for (uint32_t i = 0; i < mf->hash_count; ++i)
			mf->hash[i] = EMPTY_HASH_VALUE;
*/
		memzero(mf->hash, mf->hash_count * sizeof(uint32_t));
	}

	mf->cyclic_pos = 0;

	// Handle preset dictionary.
	if (lz_options->preset_dict != NULL
			&& lz_options->preset_dict_size > 0) {
		// If the preset dictionary is bigger than the actual
		// dictionary, use only the tail.
		mf->write_pos = my_min(lz_options->preset_dict_size, mf->size);
		memcpy(mf->buffer, lz_options->preset_dict
				+ lz_options->preset_dict_size - mf->write_pos,
				mf->write_pos);
		mf->action = LZMA_SYNC_FLUSH;
		mf->skip(mf, mf->write_pos);
	}

	mf->action = LZMA_RUN;

	return false;
}